

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

ostream * spvtools::opt::operator<<(ostream *str,Module *module)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.cpp:276:22)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/module.cpp:276:22)>
             ::_M_manager;
  local_30._M_unused._0_8_ = (undefined8)str;
  Module::ForEachInst(module,(function<void_(const_spvtools::opt::Instruction_*)> *)&local_30,false)
  ;
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const Module& module) {
  module.ForEachInst([&str](const Instruction* inst) {
    str << *inst;
    if (inst->opcode() != spv::Op::OpFunctionEnd) {
      str << std::endl;
    }
  });
  return str;
}